

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O1

char * trimWhitespace(char *str)

{
  char *pcVar1;
  ushort **ppuVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  
  ppuVar2 = __ctype_b_loc();
  pcVar1 = gTempBuf;
  do {
    __s = pcVar1;
    pcVar1 = __s + 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)*__s * 2 + 1) & 0x20) != 0);
  if (*__s != '\0') {
    sVar3 = strlen(__s);
    if (0 < (int)(uint)sVar3) {
      lVar4 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
      do {
        if ((*(byte *)((long)*ppuVar2 + (long)__s[lVar4 + -2] * 2 + 1) & 0x20) == 0) {
          return __s;
        }
        __s[lVar4 + -2] = '\0';
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
  }
  return __s;
}

Assistant:

static char *trimWhitespace( char *str )
{
   int i;

   if( !str ) return str;

   while( isspace(*str) ) str++;
   if( *str == '\0' ) return str;

   for( i=(int)strlen(str)-1; i >= 0; i-- )
   {
      if( !isspace(str[i]) )
         return str;
      str[i] = '\0';
   }

   return str;
}